

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     compare_types_cast<void,chaiscript::Type_Info_const&,chaiscript::Type_Info_const&,std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>const&>
               (_func_void_Type_Info_ptr_Type_Info_ptr_function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_ptr
                *param_1,Function_Params *params,Type_Conversions_State *t_conversions)

{
  size_t sVar1;
  Boxed_Value *pBVar2;
  chaiscript *this;
  Type_Conversions_State *in_RCX;
  bad_boxed_cast *anon_var_0;
  size_t local_30;
  size_type i;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_void_Type_Info_ptr_Type_Info_ptr_function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_ptr
  *param_0_local;
  
  local_30 = 1;
  i = (size_type)t_conversions;
  t_conversions_local = (Type_Conversions_State *)params;
  params_local = (Function_Params *)param_1;
  pBVar2 = Function_Params::operator[](params,0);
  boxed_cast<chaiscript::Type_Info_const&>(pBVar2,(Type_Conversions_State *)i);
  sVar1 = local_30;
  local_30 = local_30 + 1;
  pBVar2 = Function_Params::operator[]((Function_Params *)t_conversions_local,sVar1);
  boxed_cast<chaiscript::Type_Info_const&>(pBVar2,(Type_Conversions_State *)i);
  sVar1 = local_30;
  local_30 = local_30 + 1;
  this = (chaiscript *)Function_Params::operator[]((Function_Params *)t_conversions_local,sVar1);
  boxed_cast<std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>const&>
            ((function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *)&anon_var_0,this
             ,(Boxed_Value *)i,in_RCX);
  std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>::~function
            ((function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *)&anon_var_0);
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }